

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ops-h2.c
# Opt level: O0

int rops_tx_credit_h2(lws *wsi,char peer_to_us,int add)

{
  lws *plVar1;
  int local_2c;
  int n;
  lws *nwsi;
  int add_local;
  char peer_to_us_local;
  lws *wsi_local;
  
  plVar1 = lws_get_network_wsi(wsi);
  if (add == 0) {
    if (peer_to_us == '\0') {
      wsi_local._4_4_ = lws_h2_tx_cr_get(wsi);
    }
    else {
      local_2c = (wsi->txc).peer_tx_cr_est;
      if ((plVar1->txc).peer_tx_cr_est < local_2c) {
        local_2c = (plVar1->txc).peer_tx_cr_est;
      }
      wsi_local._4_4_ = local_2c;
    }
  }
  else if (peer_to_us == '\x01') {
    wsi_local._4_4_ = lws_h2_update_peer_txcredit(wsi,-1,add);
  }
  else {
    (wsi->txc).tx_cr = add + (wsi->txc).tx_cr;
    (plVar1->txc).tx_cr = add + (plVar1->txc).tx_cr;
    wsi_local._4_4_ = 0;
  }
  return wsi_local._4_4_;
}

Assistant:

static int
rops_tx_credit_h2(struct lws *wsi, char peer_to_us, int add)
{
	struct lws *nwsi = lws_get_network_wsi(wsi);
	int n;

	if (add) {
		if (peer_to_us == LWSTXCR_PEER_TO_US) {
			/*
			 * We want to tell the peer they can write an additional
			 * "add" bytes to us
			 */
			return lws_h2_update_peer_txcredit(wsi, -1, add);
		}

		/*
		 * We're being told we can write an additional "add" bytes
		 * to the peer
		 */

		wsi->txc.tx_cr += add;
		nwsi->txc.tx_cr += add;

		return 0;
	}

	if (peer_to_us == LWSTXCR_US_TO_PEER)
		return lws_h2_tx_cr_get(wsi);

	n = wsi->txc.peer_tx_cr_est;
	if (n > nwsi->txc.peer_tx_cr_est)
		n = nwsi->txc.peer_tx_cr_est;

	return n;
}